

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTests.cpp
# Opt level: O0

void __thiscall Array2dTest_Access_Test::TestBody(Array2dTest_Access_Test *this)

{
  bool bVar1;
  ValueType_conflict1 *actual_expression;
  AssertionResult gtest_ar;
  int j_1;
  int i_1;
  int j;
  int i;
  Array2d<int> a;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  Array2d<int> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  ValueType_conflict1 *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  Type in_stack_ffffffffffffff8c;
  uint uVar2;
  Array2d<int> *in_stack_ffffffffffffff90;
  AssertionResult local_58;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  int iVar4;
  undefined4 in_stack_ffffffffffffffc4;
  int local_30;
  int local_2c;
  
  pica::Array2d<int>::Array2d
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
             (ValueType_conflict1)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
      in_stack_ffffffffffffff7c = local_2c + local_30;
      in_stack_ffffffffffffff80 =
           pica::Array2d<int>::operator()
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
      ;
      *in_stack_ffffffffffffff80 = in_stack_ffffffffffffff7c;
    }
  }
  for (iVar4 = 0; iVar4 < 3; iVar4 = iVar4 + 1) {
    for (iVar3 = 0; iVar3 < 5; iVar3 = iVar3 + 1) {
      actual_expression =
           pica::Array2d<int>::operator()
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
      ;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (char *)actual_expression,
                 (int *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                 (int *)in_stack_ffffffffffffff60);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
      in_stack_ffffffffffffff6f = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff90);
        in_stack_ffffffffffffff60 =
             (Array2d<int> *)testing::AssertionResult::failure_message((AssertionResult *)0x22ac13);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                   (char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                   (char *)actual_expression);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_ffffffffffffffc4,iVar4),
                   (Message *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff60);
        testing::Message::~Message((Message *)0x22ac61);
      }
      uVar2 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x22acb1);
      if (uVar2 != 0) goto LAB_0022acf3;
      in_stack_ffffffffffffff8c = kSuccess;
    }
  }
LAB_0022acf3:
  pica::Array2d<int>::~Array2d((Array2d<int> *)0x22ad00);
  return;
}

Assistant:

TEST(Array2dTest, Access)
{
    Array2d<int> a(3, 5, -1);
    for (int i = 0; i < 3; i++)
    for (int j = 0; j < 5; j++)
        a(i, j) = i + j;
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 5; j++)
        ASSERT_EQ(i + j, a(i, j));
}